

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O3

void __thiscall Arithmetic_NumReuse_Test::TestBody(Arithmetic_NumReuse_Test *this)

{
  ulong uVar1;
  long *plVar2;
  AssertionResult *this_00;
  char *pcVar3;
  char *in_R9;
  bool bVar4;
  undefined1 local_180 [8];
  MockCompiler mock;
  BcIns arr [2];
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  
  mock.cur_ins = 0x500000005;
  MockCompiler::MockCompiler((MockCompiler *)local_180,(BcIns *)&mock.cur_ins,2);
  bVar4 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)arr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x97,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arr);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,gtest_ar_.message_.ptr_._0_2_)) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             gtest_ar_.message_.ptr_._0_2_)), plVar2 != (long *)0x0)
         ) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
  local_30 = (undefined1  [8])(uVar1 & 0xffff);
  gtest_ar_.message_.ptr_._0_2_ = 0;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
  testing::internal::CmpHelperEQ<unsigned_long,IrOp>
            ((internal *)local_50,"ir_op(ins)","IR_LOAD_STACK",(unsigned_long *)local_30,
             (IrOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x10);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg1(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x20);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg2(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x97,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)arr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x98,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arr);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,gtest_ar_.message_.ptr_._0_2_)) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             gtest_ar_.message_.ptr_._0_2_)), plVar2 != (long *)0x0)
         ) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
  local_30 = (undefined1  [8])(uVar1 & 0xffff);
  gtest_ar_.message_.ptr_._0_2_ = 1;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
  testing::internal::CmpHelperEQ<unsigned_long,IrOp>
            ((internal *)local_50,"ir_op(ins)","IR_LOAD_CONST",(unsigned_long *)local_30,
             (IrOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x10);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg1(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x20);
  local_30 = (undefined1  [8])((ulong)local_30 & 0xffffffff00000000);
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg2(ins)","0",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x98,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (!bVar4) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)arr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x99,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arr);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    if (CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                 CONCAT22(gtest_ar_.message_.ptr_._2_2_,gtest_ar_.message_.ptr_._0_2_)) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (plVar2 = (long *)CONCAT44(gtest_ar_.message_.ptr_._4_4_,
                                    CONCAT22(gtest_ar_.message_.ptr_._2_2_,
                                             gtest_ar_.message_.ptr_._0_2_)), plVar2 != (long *)0x0)
         ) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
  local_30 = (undefined1  [8])(uVar1 & 0xffff);
  gtest_ar_.message_.ptr_._0_2_ = 0x100;
  gtest_ar_.message_.ptr_._2_2_ = 0;
  mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
  testing::internal::CmpHelperEQ<unsigned_long,IrOp>
            ((internal *)local_50,"ir_op(ins)","IR_ADD",(unsigned_long *)local_30,
             (IrOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x10);
  local_30._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg1(ins)","1",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x20);
  local_30._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_short,int>
            ((internal *)local_50,"ir_arg2(ins)","2",(unsigned_short *)&gtest_ar_.message_,
             (int *)local_30);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x99,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    if (local_30 != (undefined1  [8])0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_30 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_30 + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    goto LAB_0010a660;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = mock.trace < (Trace *)(long)*(int *)(mock.vm._264_8_ + 0x10);
  local_30[0] = bVar4;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  if (bVar4) {
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
    uVar1 = *(ulong *)(*(long *)(mock.vm._264_8_ + 8) + (long)mock.trace * 8);
    local_30 = (undefined1  [8])(uVar1 & 0xffff);
    gtest_ar_.message_.ptr_._0_2_ = 0x100;
    gtest_ar_.message_.ptr_._2_2_ = 0;
    mock.trace = (Trace *)((long)&(mock.trace)->vm + 1);
    testing::internal::CmpHelperEQ<unsigned_long,IrOp>
              ((internal *)local_50,"ir_op(ins)","IR_ADD",(unsigned_long *)local_30,
               (IrOp *)&gtest_ar_.message_);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                 ,0x9a,pcVar3);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
LAB_0010ab91:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message((Message *)local_30);
    }
    else {
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x10);
      local_30._0_4_ = 3;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"ir_arg1(ins)","3",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                   ,0x9a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_0010ab91;
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
      gtest_ar_.message_.ptr_._0_2_ = (undefined2)(uVar1 >> 0x20);
      local_30._0_4_ = 2;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"ir_arg2(ins)","2",(unsigned_short *)&gtest_ar_.message_,
                 (int *)local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
                   ,0x9a,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)local_30);
        goto LAB_0010ab91;
      }
    }
    this_00 = (AssertionResult *)local_50;
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)local_30,
               (AssertionResult *)"mock.cur_ins < mock.trace->ir_count","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)arr,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_compiler.cpp"
               ,0x9a,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)arr,(Message *)&gtest_ar_.message_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)arr);
    if ((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)CONCAT71(local_50._1_7_,local_50[0]) != &gtest_ar.message_) {
      operator_delete((undefined1 *)CONCAT71(local_50._1_7_,local_50[0]),
                      (ulong)((long)&((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 1));
    }
    testing::Message::~Message((Message *)&gtest_ar_.message_);
    this_00 = (AssertionResult *)local_30;
  }
  testing::AssertionResult::~AssertionResult(this_00);
LAB_0010a660:
  MockCompiler::~MockCompiler((MockCompiler *)local_180);
  return;
}

Assistant:

TEST(Arithmetic, NumReuse) {
	// let a = 0 while true { a = a + 1 a = a + 1}
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
		BC3(BC_ADD_LN, 0, 0, 0),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
	INS(IR_ADD, 3, 2);
}